

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O0

bool cfd::core::MatchWallyTx(wally_tx *src,wally_tx *dest)

{
  pointer tx;
  bool bVar1;
  uchar *puVar2;
  size_type sVar3;
  CfdException *pCVar4;
  allocator local_e1;
  string local_e0;
  CfdSourceLocation local_c0;
  undefined1 local_a2;
  allocator local_a1;
  string local_a0;
  CfdSourceLocation local_80;
  int local_68;
  allocator<unsigned_char> local_61;
  int ret;
  vector<unsigned_char,_std::allocator<unsigned_char>_> dest_txid;
  allocator<unsigned_char> local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> src_txid;
  wally_tx *dest_local;
  wally_tx *src_local;
  
  src_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)dest;
  ::std::allocator<unsigned_char>::allocator(&local_31);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x20,&local_31);
  ::std::allocator<unsigned_char>::~allocator(&local_31);
  ::std::allocator<unsigned_char>::allocator(&local_61);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret,0x20,&local_61);
  ::std::allocator<unsigned_char>::~allocator(&local_61);
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  local_68 = wally_tx_get_txid(src,puVar2,sVar3);
  tx = src_txid.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  if (local_68 != 0) {
    local_80.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_80.filename = local_80.filename + 1;
    local_80.line = 0x148;
    local_80.funcname = "MatchWallyTx";
    logger::warn<int&>(&local_80,"wally_tx_get_txid NG[{}]",&local_68);
    local_a2 = 1;
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_a0,"psbt get txid error.",&local_a1);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_a0);
    local_a2 = 0;
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  puVar2 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  sVar3 = ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  local_68 = wally_tx_get_txid((wally_tx *)tx,puVar2,sVar3);
  if (local_68 != 0) {
    local_c0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/src/cfdcore_psbt.cpp"
                 ,0x2f);
    local_c0.filename = local_c0.filename + 1;
    local_c0.line = 0x14d;
    local_c0.funcname = "MatchWallyTx";
    logger::warn<int&>(&local_c0,"wally_tx_get_txid NG[{}]",&local_68);
    pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_e0,"psbt get txid error.",&local_e1);
    CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,&local_e0);
    __cxa_throw(pCVar4,&CfdException::typeinfo,CfdException::~CfdException);
  }
  bVar1 = ::std::operator==((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,
                            (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&ret);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  return bVar1;
}

Assistant:

bool MatchWallyTx(struct wally_tx *src, struct wally_tx *dest) {
  std::vector<uint8_t> src_txid(WALLY_TXHASH_LEN);
  std::vector<uint8_t> dest_txid(WALLY_TXHASH_LEN);
  int ret = wally_tx_get_txid(src, src_txid.data(), src_txid.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_txid NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt get txid error.");
  }
  ret = wally_tx_get_txid(dest, dest_txid.data(), dest_txid.size());
  if (ret != WALLY_OK) {
    warn(CFD_LOG_SOURCE, "wally_tx_get_txid NG[{}]", ret);
    throw CfdException(kCfdIllegalArgumentError, "psbt get txid error.");
  }
  return (src_txid == dest_txid);
}